

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fshook_stdio.c
# Opt level: O0

_Bool fs_stdio_update_entry(ALLEGRO_FS_ENTRY *fp)

{
  int errnum;
  long in_RDI;
  bool bVar1;
  int ret;
  ALLEGRO_FS_ENTRY_STDIO *fp_stdio;
  
  errnum = stat(*(char **)(in_RDI + 8),(stat *)(in_RDI + 0x18));
  bVar1 = errnum != -1;
  if (bVar1) {
    fs_update_stat_mode((ALLEGRO_FS_ENTRY_STDIO *)0x1777a2);
  }
  else {
    __errno_location();
    al_set_errno(errnum);
  }
  return bVar1;
}

Assistant:

static bool fs_stdio_update_entry(ALLEGRO_FS_ENTRY *fp)
{
   ALLEGRO_FS_ENTRY_STDIO *fp_stdio = (ALLEGRO_FS_ENTRY_STDIO *) fp;
   int ret;

   ret = WRAP_STAT(fp_stdio->abs_path, &(fp_stdio->st));
   if (ret == -1) {
      al_set_errno(errno);
      return false;
   }

   fs_update_stat_mode(fp_stdio);

   return true;
}